

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::texparameterIiv(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType ctxType;
  NotSupportedError *this;
  GLint textureMode [2];
  string local_40;
  undefined1 *local_20;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar2) {
    local_20 = (undefined1 *)0x190100001902;
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_INVALID_ENUM is generated if target is not a valid target.",
               "");
    NegativeTestContext::beginSection(ctx,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0,0x90ea,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_INVALID_ENUM is generated if pname is not a valid parameter."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_20 = (undefined1 *)0xffffffffffffffff;
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x90ea,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x884c,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x884d,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x2800,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x2801,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x8e42,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x8e43,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x8e44,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x8e45,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x2802,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x2803,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x8072,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x813c,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0xde1,0x813d,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_20 = (undefined1 *)0x0;
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x1004,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x2801,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x2800,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x2802,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x2803,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x8072,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x813a,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x813b,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x884c,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x884d,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x1004,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x2801,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x2800,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x2802,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x2803,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x8072,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x813a,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x813b,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x884c,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x884d,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_20 = &DAT_100000001;
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9100,0x813c,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glTexParameterIiv
              (&ctx->super_CallLogWrapper,0x9102,0x813c,(GLint *)&local_20);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"glTexParameterIiv is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
             ,0x8b8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void texparameterIiv (NegativeTestContext& ctx)
{
	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("glTexParameterIiv is not supported.", DE_NULL, __FILE__, __LINE__);

	GLint textureMode[] = { GL_DEPTH_COMPONENT, GL_STENCIL_INDEX };
	ctx.beginSection("GL_INVALID_ENUM is generated if target is not a valid target.");
	ctx.glTexParameterIiv(0, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not a valid parameter.");
	ctx.glTexParameterIiv(GL_TEXTURE_2D, 0, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	textureMode[0] = -1;
	textureMode[1] = -1;
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	textureMode[0] = 0;
	textureMode[1] = 0;
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);

	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	textureMode[0] = 1;
	textureMode[1] = 1;
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}